

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O0

void test_mu_deadline(testing t)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  char *msg;
  nsync_time nVar4;
  nsync_time nVar5;
  nsync_time nVar6;
  nsync_time a;
  ulong in_stack_fffffffffffffe30;
  char *elapsed_str;
  _func_int_void_ptr_void_ptr *local_b8;
  nsync_note local_b0;
  nsync_time expected_end_time;
  nsync_time start_time;
  nsync_time end_time;
  __time_t local_58;
  __syscall_slong_t local_50;
  nsync_time too_late;
  nsync_time too_early;
  nsync_mu mu;
  int too_late_violations;
  int i;
  testing t_local;
  
  nsync::nsync_mu_init((nsync_mu *)&too_early.tv_nsec);
  nVar4 = nsync::nsync_time_ms(1);
  local_58 = nVar4.tv_sec;
  local_50 = nVar4.tv_nsec;
  too_early.tv_sec = local_50;
  nVar4 = nsync::nsync_time_ms(100);
  mu.waiters._0_4_ = 0;
  nsync::nsync_mu_lock((nsync_mu *)&too_early.tv_nsec);
  for (mu.waiters._4_4_ = 0; mu.waiters._4_4_ != 0x32; mu.waiters._4_4_ = mu.waiters._4_4_ + 1) {
    nVar5 = nsync::nsync_time_now();
    nVar6 = nsync::nsync_time_ms(0x57);
    nVar5 = nsync::nsync_time_add(nVar5,nVar6);
    local_b8 = (_func_int_void_ptr_void_ptr *)nVar5.tv_sec;
    local_b0 = (nsync_note)nVar5.tv_nsec;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_stack_fffffffffffffe30;
    iVar2 = nsync::nsync_mu_wait_with_deadline
                      ((nsync *)&too_early.tv_nsec,(nsync_mu *)false_condition,
                       (_func_int_void_ptr *)0x0,(void *)0x0,local_b8,(nsync_time)(auVar1 << 0x40),
                       local_b0);
    if (iVar2 != 0x6e) {
      pcVar3 = smprintf("nsync_mu_wait() returned non-expired for a timeout");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/mu_wait_test.c"
                     ,0xec,pcVar3);
    }
    a = nsync::nsync_time_now();
    nVar6.tv_nsec = too_early.tv_sec;
    nVar6.tv_sec = local_58;
    nVar6 = nsync::nsync_time_sub(nVar5,nVar6);
    iVar2 = nsync::nsync_time_cmp(a,nVar6);
    if (iVar2 < 0) {
      nVar6 = nsync::nsync_time_sub(nVar5,a);
      pcVar3 = nsync_time_str(nVar6,2);
      msg = smprintf("nsync_mu_wait() returned %s too early",pcVar3);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/mu_wait_test.c"
                     ,0xf1,msg);
      free(pcVar3);
    }
    nVar5 = nsync::nsync_time_add(nVar5,nVar4);
    iVar2 = nsync::nsync_time_cmp(nVar5,a);
    if (iVar2 < 0) {
      mu.waiters._0_4_ = (uint)mu.waiters + 1;
    }
  }
  nsync::nsync_mu_unlock((nsync_mu *)&too_early.tv_nsec);
  if (0x19 < (int)(uint)mu.waiters) {
    pcVar3 = smprintf("nsync_mu_wait() returned too late %d (> %d) times",(ulong)(uint)mu.waiters,
                      0x19);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/mu_wait_test.c"
                   ,0xfb,pcVar3);
  }
  return;
}

Assistant:

static void test_mu_deadline (testing t) {
	int i;
	int too_late_violations;
	nsync_mu mu;
	nsync_time too_early;
	nsync_time too_late;

	nsync_mu_init (&mu);
	too_early = nsync_time_ms (TOO_EARLY_MS);
	too_late = nsync_time_ms (TOO_LATE_MS);
	too_late_violations = 0;
	nsync_mu_lock (&mu);;
	for (i = 0; i != 50; i++) {
		nsync_time end_time;
		nsync_time start_time;
		nsync_time expected_end_time;
		start_time = nsync_time_now ();
		expected_end_time = nsync_time_add (start_time, nsync_time_ms (87));
		if (nsync_mu_wait_with_deadline (&mu, &false_condition, NULL, NULL,
						 expected_end_time, NULL) != ETIMEDOUT) {
			TEST_FATAL (t, ("nsync_mu_wait() returned non-expired for a timeout"));
		}
		end_time = nsync_time_now ();
		if (nsync_time_cmp (end_time, nsync_time_sub (expected_end_time, too_early)) < 0) {
			char *elapsed_str = nsync_time_str (nsync_time_sub (expected_end_time, end_time), 2);
			TEST_ERROR (t, ("nsync_mu_wait() returned %s too early", elapsed_str));
			free (elapsed_str);
		}
		if (nsync_time_cmp (nsync_time_add (expected_end_time, too_late),  end_time) < 0) {
			too_late_violations++;
		}
	}
	nsync_mu_unlock (&mu);
	if (too_late_violations > TOO_LATE_ALLOWED) {
		TEST_ERROR (t, ("nsync_mu_wait() returned too late %d (> %d) times",
			   too_late_violations, TOO_LATE_ALLOWED));
	}
}